

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

size_t varint_from_bytes(uchar *bytes,uint64_t *v)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  
  bVar1 = *bytes;
  uVar3 = (ulong)bVar1;
  if (bVar1 == 0xff) {
    uVar3 = *(ulong *)(bytes + 1);
    sVar2 = 9;
  }
  else if (bVar1 == 0xfe) {
    uVar3 = (ulong)*(uint *)(bytes + 1);
    sVar2 = 5;
  }
  else if (bVar1 == 0xfd) {
    uVar3 = (ulong)*(ushort *)(bytes + 1);
    sVar2 = 3;
  }
  else {
    sVar2 = 1;
  }
  *v = uVar3;
  return sVar2;
}

Assistant:

size_t varint_from_bytes(const unsigned char *bytes, uint64_t *v)
{
#define b(n) ((uint64_t)bytes[n] << ((n - 1) * 8))
    switch (*bytes) {
    case VI_TAG_16:
        *v = b(2) | b(1);
        return sizeof(uint8_t) + sizeof(uint16_t);
    case VI_TAG_32:
        *v = b(4) | b(3) | b(2) | b(1);
        return sizeof(uint8_t) + sizeof(uint32_t);
    case VI_TAG_64:
        *v = b(8) | b(7) | b(6) | b(5) | b(4) | b(3) | b(2) | b(1);
        return sizeof(uint8_t) + sizeof(uint64_t);
    }
    *v = *bytes;
    return sizeof(uint8_t);
#undef b
}